

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::UnpackHalf2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackHalf2x16CaseInstance *this)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  ShaderExecutor *pSVar3;
  bool bVar4;
  Float<unsigned_short,_5,_10,_15,_3U> FVar5;
  Float<unsigned_short,_5,_10,_15,_3U> FVar6;
  deUint32 dVar7;
  uint uVar8;
  deUint32 dVar9;
  Float<unsigned_int,_8,_23,_127,_3U> FVar10;
  Float<unsigned_int,_8,_23,_127,_3U> FVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  sbyte sVar15;
  long lVar16;
  bool bVar17;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  deUint32 inVal;
  Random rnd;
  Hex<8UL> local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  ulong local_218;
  UnpackHalf2x16CaseInstance *local_210;
  TestStatus *local_208;
  int local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  undefined1 local_1e8 [16];
  pointer local_1d8;
  ulong local_1c8;
  undefined1 local_1c0 [16];
  TestLog local_1b0 [13];
  ios_base local_148 [264];
  deRandom local_40;
  
  local_210 = this;
  local_208 = __return_storage_ptr__;
  dVar7 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar7 ^ 0x776002);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1d8 = (pointer)0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1c0._0_4_ = 0;
  FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_1c0._0_4_ = 0x3f800000;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_240.value._0_4_ = CONCAT22(FVar5.m_value,FVar6.m_value);
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_240);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_240.value;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1c0._0_4_ = 0x3f800000;
  FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_1c0._0_8_ = (ulong)(uint)local_1c0._4_4_ << 0x20;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_240.value._0_4_ = CONCAT22(FVar5.m_value,FVar6.m_value);
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_240);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_240.value;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1c0._0_4_ = 0xbf800000;
  FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_1c0._0_4_ = 0x3f000000;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_240.value._0_4_ = CONCAT22(FVar5.m_value,FVar6.m_value);
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_240);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_240.value;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1c0._0_4_ = 0x3f000000;
  FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_1c0._0_4_ = 0xbf000000;
  FVar6 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                    ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
  local_240.value._0_4_ = CONCAT22(FVar5.m_value,FVar6.m_value);
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_240);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = CONCAT22(FVar5.m_value,FVar6.m_value);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar14 = 0;
  do {
    local_218 = CONCAT44(local_218._4_4_,iVar14);
    local_1c0._0_4_ = 0;
    sVar15 = 0;
    bVar4 = true;
    do {
      bVar17 = bVar4;
      uVar8 = deRandom_getBool(&local_40);
      dVar7 = deRandom_getUint32(&local_40);
      dVar9 = deRandom_getUint32(&local_40);
      iVar14 = (dVar7 / 0x1e) * -0x1f + dVar7 / 0x1e;
      if (uVar8 != 1) {
        uVar8 = 0x8000;
      }
      local_1c0._0_4_ =
           ((uVar8 | (iVar14 + dVar7 + -0xe + (uint)(iVar14 + dVar7 == 0xe)) * 0x400 + 0x3c00) &
            0xfc00 | dVar9 & 0x3ff) << sVar15 | local_1c0._0_4_;
      sVar15 = 0x10;
      bVar4 = false;
    } while (bVar17);
    if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_238,
                 (iterator)
                 local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1c0);
    }
    else {
      *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1c0._0_4_;
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar14 = (int)local_218 + 1;
  } while (iVar14 != 0x60);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_1e8,
             (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1c0._0_8_ = ((local_210->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  local_1c0._0_8_ =
       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_240.value = local_1e8._0_8_;
  pSVar3 = (local_210->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  local_218 = 0;
  (*pSVar3->_vptr_ShaderExecutor[2])
            (pSVar3,(ulong)((long)local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1c0,&local_240
             ,0);
  local_1c8 = (ulong)((long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  if (0 < (int)local_1c8) {
    poVar1 = (ostringstream *)(local_1c0 + 8);
    lVar16 = 0;
    local_218 = 0;
    do {
      uVar2 = *(undefined4 *)
               ((long)(qpTestLog **)
                      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar16 * 4);
      local_1c0._0_2_ = (StorageType_conflict)uVar2;
      FVar10 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)local_1c0);
      local_1c0._0_2_ = (short)((uint)uVar2 >> 0x10);
      FVar11 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                         ((Float<unsigned_short,_5,_10,_15,_3U> *)local_1c0);
      local_1ec = ((pointer)(local_1e8._0_8_ + lVar16 * 8))->m_data[0];
      local_1f0 = ((pointer)(local_1e8._0_8_ + lVar16 * 8))->m_data[1];
      iVar12 = FVar10.m_value - (int)local_1ec;
      iVar14 = -iVar12;
      if (0 < iVar12) {
        iVar14 = iVar12;
      }
      iVar13 = FVar11.m_value - (int)local_1f0;
      iVar12 = -iVar13;
      if (0 < iVar13) {
        iVar12 = iVar13;
      }
      if ((0 < iVar14) || (0 < iVar12)) {
        iVar13 = (int)local_218;
        if (iVar13 < 10) {
          local_1c0._0_8_ = ((local_210->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          local_1fc = iVar12;
          local_1f8 = local_1f0;
          local_1f4 = local_1ec;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)lVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackHalf2x16(",0x1a);
          local_240.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar16 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_240,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec2(",5);
          std::ostream::_M_insert<double>((double)(float)FVar10.m_value);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_240.value = (deUint64)FVar10.m_value;
          tcu::Format::Hex<8UL>::toStream(&local_240,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)(float)FVar11.m_value);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_240.value = (deUint64)FVar11.m_value;
          tcu::Format::Hex<8UL>::toStream(&local_240,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got vec2(",0xb);
          std::ostream::_M_insert<double>((double)local_1ec);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_240.value = (deUint64)(uint)local_1f4;
          tcu::Format::Hex<8UL>::toStream(&local_240,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<double>((double)local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
          local_240.value = (deUint64)(uint)local_1f8;
          tcu::Format::Hex<8UL>::toStream(&local_240,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\n  ULP diffs = (",0x10);
          std::ostream::operator<<(poVar1,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::operator<<(poVar1,local_1fc);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), max diff = ",0xe)
          ;
          std::ostream::operator<<(poVar1,0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0082b43b:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c0 + 8));
          std::ios_base::~ios_base(local_148);
          iVar13 = (int)local_218;
        }
        else if (iVar13 == 10) {
          local_1c0._0_8_ = ((local_210->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1c0 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0082b43b;
        }
        local_218 = (ulong)(iVar13 + 1);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)((ulong)((long)local_238.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_238.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_1c0._0_8_ = ((local_210->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar14 = (int)local_1c8;
  std::ostream::operator<<(poVar1,iVar14 - (int)local_218);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_148);
  if ((int)local_218 == 0) {
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"Pass","");
    local_208->m_code = QP_TEST_RESULT_PASS;
    (local_208->m_description)._M_dataplus._M_p = (pointer)&(local_208->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208->m_description,local_1c0._0_8_,
               (long)(qpTestLog **)local_1c0._0_8_ + local_1c0._8_8_);
  }
  else {
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"Result comparison failed","");
    local_208->m_code = QP_TEST_RESULT_FAIL;
    (local_208->m_description)._M_dataplus._M_p = (pointer)&(local_208->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208->m_description,local_1c0._0_8_,
               (long)(qpTestLog **)local_1c0._0_8_ + local_1c0._8_8_);
  }
  if ((TestLog *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)((long)&(local_1b0[0].m_log)->flags + 1));
  }
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8 - local_1e8._0_8_);
  }
  if ((TestLog *)
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_208;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const int					maxDiff		= 0; // All bits must be accurate.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		// Special values.
		inputs.push_back((tcu::Float16( 0.0f).bits() << 16) | tcu::Float16( 1.0f).bits());
		inputs.push_back((tcu::Float16( 1.0f).bits() << 16) | tcu::Float16( 0.0f).bits());
		inputs.push_back((tcu::Float16(-1.0f).bits() << 16) | tcu::Float16( 0.5f).bits());
		inputs.push_back((tcu::Float16( 0.5f).bits() << 16) | tcu::Float16(-0.5f).bits());

		// Construct random values.
		{
			const int	minExp		= -14;
			const int	maxExp		= 15;
			const int	mantBits	= 10;

			for (int ndx = 0; ndx < 96; ndx++)
			{
				deUint32 inVal = 0;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<mantBits)-1);
					const deUint16	value		= tcu::Float16::construct(s, exp ? exp : 1 /* avoid denorm */, (deUint16)((1u<<10) | mantissa)).bits();

					inVal |= value << (16*c);
				}
				inputs.push_back(inVal);
			}
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= tcu::Float16(in0).asFloat();
				const float		ref1		= tcu::Float16(in1).asFloat();
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	refBits0	= tcu::Float32(ref0).bits();
				const deUint32	refBits1	= tcu::Float32(ref1).bits();
				const deUint32	resBits0	= tcu::Float32(res0).bits();
				const deUint32	resBits1	= tcu::Float32(res1).bits();

				const int		diff0	= de::abs((int)refBits0 - (int)resBits0);
				const int		diff1	= de::abs((int)refBits1 - (int)resBits1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackHalf2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << ref0 << " / " << tcu::toHex(refBits0) << ", " << ref1 << " / " << tcu::toHex(refBits1) << ")"
															   << ", got vec2(" << res0 << " / " << tcu::toHex(resBits0) << ", " << res1 << " / " << tcu::toHex(resBits1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}